

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromString(MessageLite *this,string *data)

{
  MessageFactory *pMVar1;
  int size;
  uint uVar2;
  uint8 *buffer;
  bool local_ba;
  string *data_local;
  MessageLite *this_local;
  undefined1 local_80 [8];
  CodedInputStream input;
  
  buffer = (uint8 *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  input.extension_factory_ = (MessageFactory *)this;
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_80,buffer,size);
  pMVar1 = input.extension_factory_;
  (*(input.extension_factory_)->_vptr_MessageFactory[4])();
  uVar2 = (*pMVar1->_vptr_MessageFactory[8])(pMVar1,(CodedInputStream *)local_80);
  local_ba = false;
  if ((uVar2 & 1) != 0) {
    local_ba = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)local_80);
  }
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_80);
  return local_ba;
}

Assistant:

bool MessageLite::ParsePartialFromString(const string& data) {
  return InlineParsePartialFromArray(data.data(), data.size(), this);
}